

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

size_type fs_max_component(string_view path)

{
  string_view path_00;
  int *piVar1;
  const_pointer __path;
  error_code eVar2;
  string_view local_58;
  error_category *local_48;
  char *local_40;
  char *local_38;
  long r;
  error_code ec;
  string_view path_local;
  
  ec._M_cat = (error_category *)path._M_len;
  eVar2 = std::make_error_code(invalid_argument);
  ec._0_8_ = eVar2._M_cat;
  r._0_4_ = eVar2._M_value;
  piVar1 = __errno_location();
  *piVar1 = 0;
  __path = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat);
  local_38 = (char *)pathconf(__path,3);
  path_local._M_str = local_38;
  if (local_38 == (char *)0xffffffffffffffff) {
    piVar1 = __errno_location();
    if (*piVar1 == 0) {
      path_local._M_str = (char *)0x100;
    }
    else {
      local_48 = ec._M_cat;
      local_40 = path._M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_58,"fs_max_component");
      path_00._M_str = local_40;
      path_00._M_len = (size_t)local_48;
      fs_print_error(path_00,local_58,(error_code *)&r);
      path_local._M_str = (char *)0x0;
    }
  }
  return (size_type)path_local._M_str;
}

Assistant:

std::string::size_type fs_max_component(std::string_view path)
{
  // maximum length of each component of a path. That is, while the maximum
  // total length of a path may be thousands of character, each segment of the
  // path has a maximum length too--typically 255 characters.

  std::error_code ec = std::make_error_code(std::errc::invalid_argument);

#ifdef _WIN32
  if(DWORD L = 0;
      GetVolumeInformationA(fs_root(path).data(), nullptr, 0, nullptr, &L, nullptr, nullptr, 0) != 0)  FFS_LIKELY
    return L;
#elif defined(_PC_NAME_MAX)
  errno = 0;
  auto const r = pathconf(path.data(), _PC_NAME_MAX);
  if(r != -1)
    return r;
  if(errno == 0)
    return DEFAULT_MAX_PATH;
#elif defined(NAME_MAX)
  return NAME_MAX;
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(path, __func__, ec);
  return {};
}